

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O0

int __thiscall bhf::ads::RegistryAccess::Import(RegistryAccess *this,istream *is)

{
  nRegHive group;
  uint32_t group_00;
  bool bVar1;
  reference this_00;
  size_type sVar2;
  uchar *puVar3;
  ostream *poVar4;
  long lVar5;
  void *pvVar6;
  string local_5b0 [32];
  stringstream local_590 [8];
  stringstream stream_2;
  ostream local_580 [376];
  long local_408;
  long status;
  uchar *local_3f8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_3f0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_3e8;
  const_iterator local_3e0;
  undefined4 local_3d4;
  string local_3d0 [32];
  stringstream local_3b0 [8];
  stringstream stream_1;
  ostream local_3a0 [376];
  string local_228 [32];
  stringstream local_208 [8];
  stringstream stream;
  ostream local_1f8 [392];
  long local_70;
  long status_1;
  RegistryEntry *next;
  iterator __end2;
  iterator __begin2;
  vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *__range2;
  value_type *key;
  vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> entries;
  int SYSTEMSERVICE_REGISTRY_INVALIDKEY;
  istream *is_local;
  RegistryAccess *this_local;
  
  entries.super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  RegFileParse((vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *)&key,is)
  ;
  __range2 = (vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *)
             std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::front
                       ((vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *
                        )&key);
  __end2 = std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::begin
                     ((vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *)
                      &key);
  next = (RegistryEntry *)
         std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::end
                   ((vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *)
                    &key);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<bhf::ads::RegistryEntry_*,_std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>_>
                                *)&next);
    if (!bVar1) {
      this_local._4_4_ = 0;
LAB_0018258b:
      local_3d4 = 1;
      std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::~vector
                ((vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *)&key);
      return this_local._4_4_;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<bhf::ads::RegistryEntry_*,_std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>_>
              ::operator*(&__end2);
    status_1 = (long)this_00;
    if (this_00->keyLen == 0) {
      local_3e8._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              (&this_00->buffer);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_3e0,&local_3e8);
      local_3f0._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__range2);
      local_3f8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      __range2);
      status = (long)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                     insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                               ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,
                                local_3e0,local_3f0,
                                (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 )local_3f8);
      group_00 = *(uint32_t *)
                  &__range2[1].
                   super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)status_1);
      puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)status_1);
      local_408 = AdsDevice::WriteReqEx(&this->device,group_00,0,sVar2,puVar3);
      if (local_408 != 0) {
        std::__cxx11::stringstream::stringstream(local_590);
        poVar4 = std::operator<<(local_580,"Import");
        poVar4 = std::operator<<(poVar4,"(): failed with: 0x");
        pvVar6 = (void *)std::ostream::operator<<(poVar4,std::hex);
        poVar4 = (ostream *)std::ostream::operator<<(pvVar6,local_408);
        std::operator<<(poVar4,'\n');
        std::__cxx11::stringstream::str();
        Logger::Log(3,local_5b0);
        std::__cxx11::string::~string((string *)local_5b0);
        std::__cxx11::stringstream::~stringstream(local_590);
        this_local._4_4_ = 1;
        goto LAB_0018258b;
      }
    }
    else {
      bVar1 = RegistryEntry::IsForDeletion(this_00);
      __range2 = (vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> *)
                 this_00;
      if (bVar1) {
        group = this_00->hive;
        sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this_00->buffer);
        puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this_00->buffer);
        local_70 = AdsDevice::WriteReqEx(&this->device,group,0,sVar2,puVar3);
        if (local_70 != 0) {
          if (local_70 != 1) {
            std::__cxx11::stringstream::stringstream(local_3b0);
            poVar4 = std::operator<<(local_3a0,"Import");
            poVar4 = std::operator<<(poVar4,"(): failed to delete registry key \"");
            std::
            map<bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::nRegHive>,_std::allocator<std::pair<const_bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at((map<bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::nRegHive>,_std::allocator<std::pair<const_bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)g_HiveMapping_abi_cxx11_,&this_00->hive);
            lVar5 = std::__cxx11::string::c_str();
            poVar4 = std::operator<<(poVar4,(char *)(lVar5 + 1));
            puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               (&this_00->buffer);
            poVar4 = std::operator<<(poVar4,puVar3);
            poVar4 = std::operator<<(poVar4,"\" with error code: 0x");
            pvVar6 = (void *)std::ostream::operator<<(poVar4,std::hex);
            poVar4 = (ostream *)std::ostream::operator<<(pvVar6,local_70);
            std::operator<<(poVar4,'\n');
            std::__cxx11::stringstream::str();
            Logger::Log(3,local_3d0);
            std::__cxx11::string::~string((string *)local_3d0);
            std::__cxx11::stringstream::~stringstream(local_3b0);
            this_local._4_4_ = 1;
            goto LAB_0018258b;
          }
          std::__cxx11::stringstream::stringstream(local_208);
          poVar4 = std::operator<<(local_1f8,"Import");
          poVar4 = std::operator<<(poVar4,"(): failed to delete registry key \"");
          std::
          map<bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::nRegHive>,_std::allocator<std::pair<const_bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::at((map<bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::nRegHive>,_std::allocator<std::pair<const_bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)g_HiveMapping_abi_cxx11_,&this_00->hive);
          lVar5 = std::__cxx11::string::c_str();
          poVar4 = std::operator<<(poVar4,(char *)(lVar5 + 1));
          puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             (&this_00->buffer);
          poVar4 = std::operator<<(poVar4,puVar3);
          std::operator<<(poVar4,"\". It could not be found in the registry of the target.\n");
          std::__cxx11::stringstream::str();
          Logger::Log(2,local_228);
          std::__cxx11::string::~string((string *)local_228);
          std::__cxx11::stringstream::~stringstream(local_208);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<bhf::ads::RegistryEntry_*,_std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

int RegistryAccess::Import(std::istream& is) const
{
    constexpr auto SYSTEMSERVICE_REGISTRY_INVALIDKEY = 1;
    auto entries = RegFileParse(is);
    const auto* key = &entries.front();
    for (auto& next: entries) {
        if (next.keyLen) {
            key = &next;
            if (key->IsForDeletion()) {
                const auto status = device.WriteReqEx(key->hive, 0, key->buffer.size(), key->buffer.data());

                switch (status) {
                case ADSERR_NOERR:
                    break; // OK

                case SYSTEMSERVICE_REGISTRY_INVALIDKEY:
                    LOG_WARN(__FUNCTION__
                             << "(): failed to delete registry key \""
                             << (g_HiveMapping.at(key->hive).c_str() + 1)
                             << key->buffer.data()
                             << "\". It could not be found in the registry of the target.\n");
                    break; // OK: The key could not be found. But that is OK, because we wanted to delete it.

                default:
                    LOG_ERROR(__FUNCTION__
                              << "(): failed to delete registry key \""
                              << (g_HiveMapping.at(key->hive).c_str() + 1)
                              << key->buffer.data()
                              << "\" with error code: 0x"
                              << std::hex << status << '\n');
                    return 1;
                }
            }
            continue;
        }

        // Prepend key path before value name
        next.buffer.insert(next.buffer.begin(), key->buffer.cbegin(), key->buffer.cend());
        const auto status = device.WriteReqEx(key->hive, 0, next.buffer.size(), next.buffer.data());
        if (ADSERR_NOERR != status) {
            LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
            return 1;
        }
    }
    return 0;
}